

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O2

void __thiscall ImageProvider::ImageProvider(ImageProvider *this,string *color_space,string *filter)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int local_2c;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__ImageProvider_0010cb38;
  this->width = 400;
  this->stripe_height = 0x50;
  std::__cxx11::string::string((string *)&this->color_space,(string *)color_space);
  std::__cxx11::string::string((string *)&this->filter,(string *)filter);
  this->n_stripes = 6;
  this_00 = &this->stripes;
  (this->stripes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stripes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stripes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stripes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  bVar1 = std::operator==(color_space,"/DeviceCMYK");
  if (bVar1) {
    local_2c = 4;
    this->j_color_space = JCS_CMYK;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_815d,&local_2c);
    local_2c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_2c);
    local_2c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_2c);
    local_2c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_818c,&local_2c);
    local_2c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_8197,&local_2c);
    local_2c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_2c);
  }
  else {
    bVar1 = std::operator==(color_space,"/DeviceRGB");
    if (bVar1) {
      this->j_color_space = JCS_RGB;
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_81c6,&local_2c);
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_2c);
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_2c);
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_81f5,&local_2c);
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_8200,&local_2c);
      local_2c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_2c);
    }
    else {
      bVar1 = std::operator==(color_space,"/DeviceGray");
      if (bVar1) {
        local_2c = 1;
        this->j_color_space = JCS_GRAYSCALE;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_8221,&local_2c);
        local_2c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_823a,&local_2c);
        local_2c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_8245,&local_2c);
        local_2c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"f",&local_2c);
        local_2c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"3",&local_2c);
        local_2c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"",&local_2c);
      }
    }
  }
  return;
}

Assistant:

ImageProvider::ImageProvider(std::string const& color_space, std::string const& filter) :
    color_space(color_space),
    filter(filter)
{
    if (color_space == "/DeviceCMYK") {
        j_color_space = JCS_CMYK;
        stripes.emplace_back("\xff\x00\x00\x00", 4);
        stripes.emplace_back("\x00\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\xff\x00", 4);
        stripes.emplace_back("\xff\x00\xff\x00", 4);
        stripes.emplace_back("\xff\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\x00\xff", 4);
    } else if (color_space == "/DeviceRGB") {
        j_color_space = JCS_RGB;
        stripes.emplace_back("\xff\x00\x00", 3);
        stripes.emplace_back("\x00\xff\x00", 3);
        stripes.emplace_back("\x00\x00\xff", 3);
        stripes.emplace_back("\xff\x00\xff", 3);
        stripes.emplace_back("\xff\xff\x00", 3);
        stripes.emplace_back("\x00\x00\x00", 3);
    } else if (color_space == "/DeviceGray") {
        j_color_space = JCS_GRAYSCALE;
        stripes.emplace_back("\xee", 1);
        stripes.emplace_back("\xcc", 1);
        stripes.emplace_back("\x99", 1);
        stripes.emplace_back("\x66", 1);
        stripes.emplace_back("\x33", 1);
        stripes.emplace_back("\x00", 1);
    }
}